

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers.cc
# Opt level: O2

void __thiscall
ctemplate::PreEscape::Modify
          (PreEscape *this,char *in,size_t inlen,PerExpandData *param_3,ExpandEmitter *out,
          string *arg)

{
  char cVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  
  pcVar6 = in + inlen;
  do {
    lVar5 = 0;
    while( true ) {
      pcVar4 = in + lVar5;
      if (pcVar6 <= pcVar4) {
        if (pcVar4 <= in) {
          return;
        }
        (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        return;
      }
      cVar1 = *pcVar4;
      if (cVar1 == '\"') {
        if (in < pcVar4) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var2 = out->_vptr_ExpandEmitter;
        pcVar4 = "&quot;";
        uVar3 = 6;
        goto LAB_0012e3cf;
      }
      uVar3 = 5;
      if (cVar1 == '&') {
        if (in < pcVar4) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var2 = out->_vptr_ExpandEmitter;
        pcVar4 = "&amp;";
        goto LAB_0012e3cf;
      }
      if (cVar1 == '\'') {
        if (in < pcVar4) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var2 = out->_vptr_ExpandEmitter;
        pcVar4 = "&#39;";
        goto LAB_0012e3cf;
      }
      uVar3 = 4;
      if (cVar1 == '<') {
        if (in < pcVar4) {
          (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
        }
        pp_Var2 = out->_vptr_ExpandEmitter;
        pcVar4 = "&lt;";
        goto LAB_0012e3cf;
      }
      if (cVar1 == '>') break;
      lVar5 = lVar5 + 1;
    }
    if (in < pcVar4) {
      (*out->_vptr_ExpandEmitter[5])(out,in,lVar5);
    }
    pp_Var2 = out->_vptr_ExpandEmitter;
    pcVar4 = "&gt;";
LAB_0012e3cf:
    (*pp_Var2[5])(out,pcVar4,uVar3);
    in = in + lVar5 + 1;
  } while( true );
}

Assistant:

void PreEscape::Modify(const char* in, size_t inlen,
                       const PerExpandData*,
                       ExpandEmitter* out, const string& arg) const {
  const char* pos = in;
  const char* start = pos;
  const char* const limit = in + inlen;
  while (pos < limit)  {
    switch (*pos) {
      default:
        // Increment our counter and look at the next character.
        ++pos;
        continue;

      // Unlike HtmlEscape, we leave whitespace as is.
      case '&':  EmitRun(start, pos, out); APPEND("&amp;");  break;
      case '"':  EmitRun(start, pos, out); APPEND("&quot;"); break;
      case '\'': EmitRun(start, pos, out); APPEND("&#39;");  break;
      case '<':  EmitRun(start, pos, out); APPEND("&lt;");   break;
      case '>':  EmitRun(start, pos, out); APPEND("&gt;");   break;
    }
    start = ++pos;
  }
  EmitRun(start, pos, out);
}